

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

Value * apply_division_operation(Value *left_value,Value *right_value,_Bool is_integer_division)

{
  Value *pVVar1;
  double dVar2;
  double dVar3;
  longdouble result;
  longdouble right_float;
  longdouble left_float;
  _Bool is_integer_division_local;
  Value *right_value_local;
  Value *left_value_local;
  
  if (((left_value->value_type == ValueTypeIntegerValue) ||
      (left_value->value_type == ValueTypeFloatValue)) &&
     ((right_value->value_type == ValueTypeIntegerValue ||
      (right_value->value_type == ValueTypeFloatValue)))) {
    if (left_value->value_type == ValueTypeFloatValue) {
      unique0x00006f00 = *(longdouble *)&left_value[1].linked_variable_count;
    }
    else {
      register0x00001100 = (longdouble)*(long *)(left_value + 1);
    }
    if (right_value->value_type == ValueTypeFloatValue) {
      unique0x00006f00 = *(longdouble *)&right_value[1].linked_variable_count;
    }
    else {
      register0x00001100 = (longdouble)*(long *)(right_value + 1);
    }
    register0x00001110 = stack0xffffffffffffffc8 / stack0xffffffffffffffb8;
    if (!is_integer_division) {
      dVar2 = ceil((double)register0x00001110);
      dVar3 = floor((double)register0x00001110);
      if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
        pVVar1 = new_float_value(register0x00001110);
        return pVVar1;
      }
    }
    left_value_local = new_integer_value((long)ROUND(register0x00001110));
  }
  else {
    left_value_local = new_null_value();
  }
  return left_value_local;
}

Assistant:

Value *apply_division_operation(Value *left_value, Value *right_value, bool is_integer_division) {
  if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float, result;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    result = left_float / right_float;

    if (is_integer_division || ceil(result) == floor(result)) {
      return new_integer_value((long long int) result);
    }
    else {
      return new_float_value(result);
    }
  }

  return new_null_value();
}